

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetlinecontrol.cpp
# Opt level: O2

void __thiscall
QWidgetLineControl::draw
          (QWidgetLineControl *this,QPainter *painter,QPoint *offset,QRect *clip,int flags)

{
  QTextFormat *this_00;
  double dVar1;
  int iVar2;
  QBrush *pQVar3;
  int iVar4;
  ColorRole cr;
  ColorRole cr_00;
  long in_FS_OFFSET;
  undefined1 local_88 [16];
  QArrayDataPointer<QTextLayout::FormatRange> local_78;
  undefined1 local_58 [8];
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78.d = (Data *)0x0;
  local_78.ptr = (FormatRange *)0x0;
  local_78.size = 0;
  if ((flags & 2U) == 0) goto LAB_003f7046;
  this_00 = (QTextFormat *)(local_58 + 8);
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)this_00);
  iVar4 = *(int *)(this + 0x110);
  iVar2 = *(int *)(this + 0x114) - iVar4;
  if (iVar2 == 0 || *(int *)(this + 0x114) < iVar4) {
    if (((byte)this[0x51] & 2) != 0) {
      iVar4 = *(int *)(this + 0x40);
      cr = Window;
      cr_00 = Text;
      iVar2 = 1;
      goto LAB_003f6fff;
    }
  }
  else {
    cr = HighlightedText;
    cr_00 = Highlight;
LAB_003f6fff:
    local_58._4_4_ = iVar2;
    local_58._0_4_ = iVar4;
    pQVar3 = QPalette::brush((QPalette *)(this + 0x30),cr_00);
    QTextFormat::setBackground(this_00,pQVar3);
    pQVar3 = QPalette::brush((QPalette *)(this + 0x30),cr);
    QTextFormat::setForeground(this_00,pQVar3);
  }
  QList<QTextLayout::FormatRange>::emplaceBack<QTextLayout::FormatRange_const&>
            ((QList<QTextLayout::FormatRange> *)&local_78,(FormatRange *)local_58);
  QTextFormat::~QTextFormat(this_00);
LAB_003f7046:
  if ((flags & 1U) != 0) {
    dVar1 = (double)(*offset).yp.m_i;
    local_88._8_4_ = SUB84(dVar1,0);
    local_88._0_8_ = (double)(*offset).xp.m_i;
    local_88._12_4_ = (int)((ulong)dVar1 >> 0x20);
    QRectF::QRectF((QRectF *)local_58,clip);
    QTextLayout::draw((QPainter *)(this + 0x118),(QPointF *)painter,(QList_conflict *)local_88,
                      (QRectF *)&local_78);
  }
  if (((flags & 4U) != 0) && ((*(ushort *)(this + 0x50) & 0x201) == 0x200)) {
    iVar4 = 0;
    if (*(int *)(this + 0x44) != -1) {
      iVar4 = *(int *)(this + 0x44);
    }
    dVar1 = (double)(*offset).yp.m_i;
    unique0x100000e0 = SUB84(dVar1,0);
    local_58 = (undefined1  [8])(double)(*offset).xp.m_i;
    unique0x100000e4 = (int)((ulong)dVar1 >> 0x20);
    QTextLayout::drawCursor
              ((QPainter *)(this + 0x118),(QPointF *)painter,(int)local_58,
               iVar4 + *(int *)(this + 0x40));
  }
  QArrayDataPointer<QTextLayout::FormatRange>::~QArrayDataPointer(&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetLineControl::draw(QPainter *painter, const QPoint &offset, const QRect &clip, int flags)
{
    QList<QTextLayout::FormatRange> selections;
    if (flags & DrawSelections) {
        QTextLayout::FormatRange o;
        if (m_selstart < m_selend) {
            o.start = m_selstart;
            o.length = m_selend - m_selstart;
            o.format.setBackground(m_palette.brush(QPalette::Highlight));
            o.format.setForeground(m_palette.brush(QPalette::HighlightedText));
        } else {
            // mask selection
            if (m_blinkStatus){
                o.start = m_cursor;
                o.length = 1;
                o.format.setBackground(m_palette.brush(QPalette::Text));
                o.format.setForeground(m_palette.brush(QPalette::Window));
            }
        }
        selections.append(o);
    }

    if (flags & DrawText)
        textLayout()->draw(painter, offset, selections, clip);

    if (flags & DrawCursor){
        int cursor = m_cursor;
        if (m_preeditCursor != -1)
            cursor += m_preeditCursor;
        if (!m_hideCursor && m_blinkStatus)
            textLayout()->drawCursor(painter, offset, cursor, m_cursorWidth);
    }
}